

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

int __thiscall amrex::ParmParse::querykth(ParmParse *this,char *name,int k,bool *ptr,int ival)

{
  Table *table;
  bool bVar1;
  allocator local_71;
  string local_70;
  string local_50;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_50,name,&local_71);
  prefixedName(&local_70,this,&local_50);
  bVar1 = anon_unknown_12::anon_unknown_0::squeryval<bool>(table,&local_70,ptr,ival,k);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return (uint)bVar1;
}

Assistant:

int
ParmParse::querykth (const char* name,
                     int         k,
                     bool&        ptr,
                     int         ival) const
{
    return squeryval(m_table, prefixedName(name),ptr,ival,k);
}